

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

int yylex(void)

{
  LexerState *pLVar1;
  bool bVar2;
  int iVar3;
  
  if ((lexerStateEOL != (LexerState *)0x0 & lexerState->atLineStart) == 1) {
    lexerState = lexerStateEOL;
    lexerStateEOL = (LexerState *)0x0;
  }
  if ((lexerState->lastToken == 0xd2) && (bVar2 = yywrap(), bVar2)) {
    return 0;
  }
  pLVar1 = lexerState;
  if ((lexerState->atLineStart == true) && (lexerState->expansions == (Expansion *)0x0)) {
    lexerState->lineNo = lexerState->lineNo + 1;
    pLVar1->colNo = 1;
  }
  iVar3 = (*yylex::lexerModeFuncs[pLVar1->mode])();
  pLVar1 = lexerState;
  if ((iVar3 == 0) && (iVar3 = 0xd2, lexerState->capturing != false)) {
    iVar3 = 0;
  }
  lexerState->lastToken = iVar3;
  pLVar1->atLineStart = iVar3 == 0xd2 || iVar3 == 0xd;
  return iVar3;
}

Assistant:

int yylex(void)
{
	if (lexerState->atLineStart && lexerStateEOL) {
		lexer_SetState(lexerStateEOL);
		lexerStateEOL = NULL;
	}
	// `lexer_SetState` updates `lexerState`, so check for EOF after it
	if (lexerState->lastToken == T_EOB && yywrap())
		return T_EOF;
	// Newlines read within an expansion should not increase the line count
	if (lexerState->atLineStart && !lexerState->expansions)
		nextLine();

	static int (* const lexerModeFuncs[])(void) = {
		AT(LEXER_NORMAL)       yylex_NORMAL,
		AT(LEXER_RAW)          yylex_RAW,
		AT(LEXER_SKIP_TO_ELIF) yylex_SKIP_TO_ELIF,
		AT(LEXER_SKIP_TO_ENDC) yylex_SKIP_TO_ENDC,
		AT(LEXER_SKIP_TO_ENDR) yylex_SKIP_TO_ENDR,
	};
	int token = lexerModeFuncs[lexerState->mode]();

	// Captures end at their buffer's boundary no matter what
	if (token == T_EOF && !lexerState->capturing)
		token = T_EOB;
	lexerState->lastToken = token;
	lexerState->atLineStart = token == T_NEWLINE || token == T_EOB;

	return token;
}